

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall LowererMD::LowerTry(LowererMD *this,Instr *tryInstr,JnHelperMethod helperMethod)

{
  LowererMDArch *this_00;
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  LabelInstr *labelInstr;
  IntConstOpnd *opndArg;
  RegOpnd *pRVar6;
  BranchInstr *pBVar7;
  LabelOpnd *pLVar8;
  StackSym *sym;
  HelperCallOpnd *src1Opnd;
  MultiBranchInstr *instr;
  
  pIVar4 = IR::Instr::GetNextRealInstrOrLabel(tryInstr);
  if ((pIVar4->m_kind != InstrKindLabel) && (pIVar4->m_kind != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x189,"(instr->IsLabelInstr())","No label at the entry to a try?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  labelInstr = IR::Instr::AsLabelInstr(pIVar4);
  Lowerer::LoadScriptContext(this->m_lowerer,&labelInstr->super_Instr);
  if (((tryInstr->m_opcode == TryCatch) || (bVar2 = Func::DoOptimizeTry(this->m_func), bVar2)) ||
     ((bVar2 = Func::IsSimpleJit(this->m_func), bVar2 && ((this->m_func->field_0x240 & 0x10) != 0)))
     ) {
    opndArg = IR::IntConstOpnd::New
                        ((long)this->m_func->m_hasBailedOutSym->m_offset,TyInt32,this->m_func,false)
    ;
    LowererMDArch::LoadHelperArgument
              (&this->lowererMDArch,&labelInstr->super_Instr,&opndArg->super_Opnd);
  }
  pRVar6 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar4 = IR::Instr::New(LdArgSize,&pRVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar4);
  this_00 = &this->lowererMDArch;
  LowererMDArch::LoadHelperArgument(this_00,&labelInstr->super_Instr,&pRVar6->super_Opnd);
  pRVar6 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar4 = IR::Instr::New(LdSpillSize,&pRVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar4);
  LowererMDArch::LoadHelperArgument(this_00,&labelInstr->super_Instr,&pRVar6->super_Opnd);
  RVar3 = LowererMDArch::GetRegBlockPointer();
  pRVar6 = IR::RegOpnd::New((StackSym *)0x0,RVar3,TyInt64,this->m_func);
  LowererMDArch::LoadHelperArgument(this_00,&labelInstr->super_Instr,&pRVar6->super_Opnd);
  pBVar7 = IR::Instr::AsBranchInstr(tryInstr);
  pLVar8 = IR::LabelOpnd::New(pBVar7->m_branchTarget,this->m_func);
  LowererMDArch::LoadHelperArgument(this_00,&labelInstr->super_Instr,&pLVar8->super_Opnd);
  pLVar8 = IR::LabelOpnd::New(labelInstr,this->m_func);
  LowererMDArch::LoadHelperArgument(this_00,&labelInstr->super_Instr,&pLVar8->super_Opnd);
  sym = StackSym::New(TyInt64,this->m_func);
  RVar3 = LowererMDArch::GetRegReturn(TyInt64);
  pRVar6 = IR::RegOpnd::New(sym,RVar3,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  pIVar4 = IR::Instr::New(Call,&pRVar6->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar4);
  LowererMDArch::LowerCall(this_00,pIVar4,0);
  pIVar4 = IR::Instr::New(NOP,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar4);
  instr = IR::MultiBranchInstr::New(JMP,&pRVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,(Instr *)instr);
  return tryInstr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LowerTry(IR::Instr *tryInstr, IR::JnHelperMethod helperMethod)
{
    // Mark the entry to the try
    IR::Instr *instr = tryInstr->GetNextRealInstrOrLabel();
    AssertMsg(instr->IsLabelInstr(), "No label at the entry to a try?");
    IR::LabelInstr *tryAddr = instr->AsLabelInstr();

    // Arg 5: ScriptContext
    this->m_lowerer->LoadScriptContext(tryAddr);

    if (tryInstr->m_opcode == Js::OpCode::TryCatch || (this->m_func->DoOptimizeTry() || (this->m_func->IsSimpleJit() && this->m_func->hasBailout)))
    {
        // Arg 4 : hasBailedOutOffset
        IR::Opnd * hasBailedOutOffset = IR::IntConstOpnd::New(this->m_func->GetHasBailedOutSym()->m_offset, TyInt32, this->m_func);
        this->LoadHelperArgument(tryAddr, hasBailedOutOffset);
    }
#ifdef _M_X64
    // Arg: args size
    IR::RegOpnd *argsSizeOpnd = IR::RegOpnd::New(TyMachReg, m_func);
    tryAddr->InsertBefore(IR::Instr::New(Js::OpCode::LdArgSize, argsSizeOpnd, this->m_func));
    this->LoadHelperArgument(tryAddr, argsSizeOpnd);

    // Arg: spill size
    IR::RegOpnd *spillSizeOpnd = IR::RegOpnd::New(TyMachReg, m_func);
    tryAddr->InsertBefore(IR::Instr::New(Js::OpCode::LdSpillSize, spillSizeOpnd, this->m_func));
    this->LoadHelperArgument(tryAddr, spillSizeOpnd);
#endif

    // Arg 3: frame pointer
    IR::RegOpnd *ebpOpnd = IR::RegOpnd::New(nullptr, lowererMDArch.GetRegBlockPointer(), TyMachReg, this->m_func);
    this->LoadHelperArgument(tryAddr, ebpOpnd);

    // Arg 2: handler address
    IR::LabelInstr *helperAddr = tryInstr->AsBranchInstr()->GetTarget();
    this->LoadHelperArgument(tryAddr, IR::LabelOpnd::New(helperAddr, this->m_func));

    // Arg 1: try address
    this->LoadHelperArgument(tryAddr, IR::LabelOpnd::New(tryAddr, this->m_func));

    // Call the helper
    IR::RegOpnd *continuationAddr =
        IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    IR::Instr *callInstr = IR::Instr::New(
        Js::OpCode::Call, continuationAddr, IR::HelperCallOpnd::New(helperMethod, this->m_func), this->m_func);
    tryAddr->InsertBefore(callInstr);
    this->LowerCall(callInstr, 0);

#ifdef _M_X64
    {
        // Emit some instruction to separate the CALL from the JMP following it. The OS stack unwinder
        // mistakes the JMP for the start of the epilog otherwise.
        IR::Instr *nop = IR::Instr::New(Js::OpCode::NOP, m_func);
        tryAddr->InsertBefore(nop);
    }
#endif

    // Jump to the continuation address supplied by the helper
    IR::BranchInstr *branchInstr = IR::MultiBranchInstr::New(Js::OpCode::JMP, continuationAddr, this->m_func);
    tryAddr->InsertBefore(branchInstr);

    return tryInstr->m_prev;
}